

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA_MAAstarClassic.cpp
# Opt level: O1

PartialPolicyPoolItemInterface_sharedPtr __thiscall
GMAA_MAAstarClassic::NewPPI(GMAA_MAAstarClassic *this,PJPDP_sharedPtr *jp,double v)

{
  PartialJPDPValuePair *this_00;
  PJPDP_sharedPtr *in_RDX;
  shared_count extraout_RDX;
  PartialPolicyPoolItemInterface_sharedPtr PVar1;
  
  this_00 = (PartialJPDPValuePair *)operator_new(0x60);
  PartialJPDPValuePair::PartialJPDPValuePair(this_00,in_RDX,v);
  boost::shared_ptr<PartialPolicyPoolItemInterface>::shared_ptr<PartialJPDPValuePair>
            ((shared_ptr<PartialPolicyPoolItemInterface> *)this,this_00);
  PVar1.pn.pi_ = extraout_RDX.pi_;
  PVar1.px = (element_type *)this;
  return PVar1;
}

Assistant:

PartialPolicyPoolItemInterface_sharedPtr
GMAA_MAAstarClassic::NewPPI(const PJPDP_sharedPtr &jp, double v) const
{
    //NOTE: this conversion to an index does save a lot of space, so
    //if we can enable this again would be better.
    //PartialPolicyPoolItemInterface* ppi=new JPPVIndexValPair(jp,v);
    //delete jp;
    PartialPolicyPoolItemInterface_sharedPtr ppi=
        PartialPolicyPoolItemInterface_sharedPtr(new PartialJPDPValuePair(jp,v));
    return (ppi);
}